

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

int __thiscall
bdHashSet::search(bdHashSet *this,string *key,uint32_t maxAge,
                 list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  bool bVar1;
  time_t tVar2;
  pointer ppVar3;
  size_type sVar4;
  time_t age;
  time_t now;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  local_40;
  iterator it;
  iterator eit;
  iterator sit;
  list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries_local;
  uint32_t maxAge_local;
  string *key_local;
  bdHashSet *this_local;
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&eit);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&it);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&local_40);
  eit = std::
        multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
        ::lower_bound(&this->mEntries,key);
  it = std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
       ::upper_bound(&this->mEntries,key);
  tVar2 = time((time_t *)0x0);
  local_40._M_node = eit._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_40,&it);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_40);
    if (tVar2 - (ppVar3->second).mStoreTS < (long)(int)maxAge) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
               ::operator->(&local_40);
      std::__cxx11::list<bdHashEntry,_std::allocator<bdHashEntry>_>::push_back
                (entries,&ppVar3->second);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
    ::operator++(&local_40,0);
  }
  sVar4 = std::__cxx11::list<bdHashEntry,_std::allocator<bdHashEntry>_>::size(entries);
  return (int)(sVar4 != 0);
}

Assistant:

int 	bdHashSet::search(std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	for (it = sit; it != eit; it++) {
		time_t age = now - it->second.mStoreTS;
		if (age < (int32_t) maxAge) {
			entries.push_back(it->second);
		}
	}
	return (0 < entries.size());
}